

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void fdct16x16_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  int *piVar1;
  int *piVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar25 [16];
  int iVar26;
  int iVar27;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  undefined1 auVar28 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar43;
  int iVar46;
  int iVar47;
  int iVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar49;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  int iVar67;
  int iVar68;
  int iVar69;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar70;
  int iVar72;
  int iVar73;
  int iVar74;
  undefined1 auVar71 [16];
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar85;
  int iVar86;
  int iVar87;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar98;
  int iVar99;
  int iVar100;
  undefined1 auVar97 [16];
  int iVar101;
  int iVar105;
  int iVar106;
  int iVar107;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  int iVar108;
  int iVar113;
  int iVar114;
  int iVar115;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined8 local_2c8;
  undefined8 local_2b8;
  undefined8 local_298;
  
  lVar20 = (long)bit * 0x100;
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar20 + 0x1a0);
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar20 + 0x1e0);
  iVar23 = -iVar5;
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar20 + 0x220);
  iVar24 = -iVar6;
  iVar21 = -iVar4;
  uVar7 = *(undefined4 *)((long)vert_filter_length_chroma + lVar20 + 0x240);
  uVar8 = *(undefined4 *)((long)vert_filter_length_chroma + lVar20 + 0x180);
  uVar9 = *(undefined4 *)((long)vert_filter_length_chroma + lVar20 + 0x1c0);
  uVar10 = *(undefined4 *)((long)vert_filter_length_chroma + lVar20 + 0x200);
  uVar11 = *(undefined4 *)((long)vert_filter_length_chroma + lVar20 + 0x250);
  uVar12 = *(undefined4 *)((long)vert_filter_length_chroma + lVar20 + 0x170);
  uVar13 = *(undefined4 *)((long)vert_filter_length_chroma + lVar20 + 0x1d0);
  uVar14 = *(undefined4 *)((long)vert_filter_length_chroma + lVar20 + 0x1f0);
  uVar15 = *(undefined4 *)((long)vert_filter_length_chroma + lVar20 + 0x210);
  uVar16 = *(undefined4 *)((long)vert_filter_length_chroma + lVar20 + 0x1b0);
  uVar17 = *(undefined4 *)((long)vert_filter_length_chroma + lVar20 + 400);
  iVar22 = 1 << ((char)bit - 1U & 0x1f);
  uVar18 = *(undefined4 *)((long)vert_filter_length_chroma + lVar20 + 0x230);
  lVar20 = 0;
  uVar19 = 0;
  if (0 < col_num) {
    uVar19 = (ulong)(uint)col_num;
  }
  for (; uVar19 * 0x10 != lVar20; lVar20 = lVar20 + 0x10) {
    piVar1 = (int *)((long)*in + lVar20);
    piVar2 = (int *)((long)in[col_num * 0xf] + lVar20);
    iVar75 = *piVar2 + *piVar1;
    iVar76 = piVar2[1] + piVar1[1];
    iVar77 = piVar2[2] + piVar1[2];
    iVar78 = piVar2[3] + piVar1[3];
    iVar26 = *piVar1 - *piVar2;
    iVar29 = piVar1[1] - piVar2[1];
    iVar31 = piVar1[2] - piVar2[2];
    iVar33 = piVar1[3] - piVar2[3];
    piVar1 = (int *)((long)in[col_num] + lVar20);
    piVar2 = (int *)((long)in[col_num * 0xe] + lVar20);
    iVar70 = *piVar2 + *piVar1;
    iVar72 = piVar2[1] + piVar1[1];
    iVar73 = piVar2[2] + piVar1[2];
    iVar74 = piVar2[3] + piVar1[3];
    iVar27 = *piVar1 - *piVar2;
    iVar30 = piVar1[1] - piVar2[1];
    iVar32 = piVar1[2] - piVar2[2];
    iVar34 = piVar1[3] - piVar2[3];
    piVar1 = (int *)((long)in[col_num * 2] + lVar20);
    piVar2 = (int *)((long)in[col_num * 0xd] + lVar20);
    iVar49 = *piVar2 + *piVar1;
    iVar54 = piVar2[1] + piVar1[1];
    iVar55 = piVar2[2] + piVar1[2];
    iVar56 = piVar2[3] + piVar1[3];
    auVar110._0_4_ = *piVar1 - *piVar2;
    auVar110._4_4_ = piVar1[1] - piVar2[1];
    auVar110._8_4_ = piVar1[2] - piVar2[2];
    auVar110._12_4_ = piVar1[3] - piVar2[3];
    piVar1 = (int *)((long)in[col_num * 3] + lVar20);
    piVar2 = (int *)((long)in[col_num * 0xc] + lVar20);
    iVar79 = *piVar2 + *piVar1;
    iVar85 = piVar2[1] + piVar1[1];
    iVar86 = piVar2[2] + piVar1[2];
    iVar87 = piVar2[3] + piVar1[3];
    auVar62._0_4_ = *piVar1 - *piVar2;
    auVar62._4_4_ = piVar1[1] - piVar2[1];
    auVar62._8_4_ = piVar1[2] - piVar2[2];
    auVar62._12_4_ = piVar1[3] - piVar2[3];
    piVar1 = (int *)((long)in[col_num * 4] + lVar20);
    piVar2 = (int *)((long)in[col_num * 0xb] + lVar20);
    iVar43 = *piVar2 + *piVar1;
    iVar46 = piVar2[1] + piVar1[1];
    iVar47 = piVar2[2] + piVar1[2];
    iVar48 = piVar2[3] + piVar1[3];
    auVar83._0_4_ = *piVar1 - *piVar2;
    auVar83._4_4_ = piVar1[1] - piVar2[1];
    auVar83._8_4_ = piVar1[2] - piVar2[2];
    auVar83._12_4_ = piVar1[3] - piVar2[3];
    piVar1 = (int *)((long)in[col_num * 5] + lVar20);
    piVar2 = (int *)((long)in[col_num * 10] + lVar20);
    iVar60 = *piVar2 + *piVar1;
    iVar67 = piVar2[1] + piVar1[1];
    iVar68 = piVar2[2] + piVar1[2];
    iVar69 = piVar2[3] + piVar1[3];
    auVar65._0_4_ = *piVar1 - *piVar2;
    auVar65._4_4_ = piVar1[1] - piVar2[1];
    auVar65._8_4_ = piVar1[2] - piVar2[2];
    auVar65._12_4_ = piVar1[3] - piVar2[3];
    piVar1 = (int *)((long)in[col_num * 6] + lVar20);
    piVar2 = (int *)((long)in[col_num * 9] + lVar20);
    iVar96 = *piVar2 + *piVar1;
    iVar98 = piVar2[1] + piVar1[1];
    iVar99 = piVar2[2] + piVar1[2];
    iVar100 = piVar2[3] + piVar1[3];
    iVar88 = *piVar1 - *piVar2;
    iVar90 = piVar1[1] - piVar2[1];
    iVar92 = piVar1[2] - piVar2[2];
    iVar94 = piVar1[3] - piVar2[3];
    piVar1 = (int *)((long)in[col_num * 7] + lVar20);
    piVar2 = (int *)((long)in[col_num * 8] + lVar20);
    iVar101 = *piVar2 + *piVar1;
    iVar105 = piVar2[1] + piVar1[1];
    iVar106 = piVar2[2] + piVar1[2];
    iVar107 = piVar2[3] + piVar1[3];
    iVar89 = *piVar1 - *piVar2;
    iVar91 = piVar1[1] - piVar2[1];
    iVar93 = piVar1[2] - piVar2[2];
    iVar95 = piVar1[3] - piVar2[3];
    iVar108 = iVar101 + iVar75;
    iVar113 = iVar105 + iVar76;
    iVar114 = iVar106 + iVar77;
    iVar115 = iVar107 + iVar78;
    iVar75 = iVar75 - iVar101;
    iVar76 = iVar76 - iVar105;
    iVar77 = iVar77 - iVar106;
    iVar78 = iVar78 - iVar107;
    iVar101 = iVar96 + iVar70;
    iVar105 = iVar98 + iVar72;
    iVar106 = iVar99 + iVar73;
    iVar107 = iVar100 + iVar74;
    auVar117._0_4_ = iVar70 - iVar96;
    auVar117._4_4_ = iVar72 - iVar98;
    auVar117._8_4_ = iVar73 - iVar99;
    auVar117._12_4_ = iVar74 - iVar100;
    iVar70 = iVar60 + iVar49;
    iVar72 = iVar67 + iVar54;
    iVar73 = iVar68 + iVar55;
    iVar74 = iVar69 + iVar56;
    auVar97._0_4_ = iVar49 - iVar60;
    auVar97._4_4_ = iVar54 - iVar67;
    auVar97._8_4_ = iVar55 - iVar68;
    auVar97._12_4_ = iVar56 - iVar69;
    iVar49 = iVar43 + iVar79;
    iVar54 = iVar46 + iVar85;
    iVar55 = iVar47 + iVar86;
    iVar56 = iVar48 + iVar87;
    iVar79 = iVar79 - iVar43;
    iVar85 = iVar85 - iVar46;
    iVar86 = iVar86 - iVar47;
    iVar87 = iVar87 - iVar48;
    auVar37._4_4_ = iVar23;
    auVar37._0_4_ = iVar23;
    auVar37._8_4_ = iVar23;
    auVar37._12_4_ = iVar23;
    auVar44 = pmulld(auVar65,auVar37);
    auVar80 = pmulld(auVar37,auVar110);
    auVar38._4_4_ = iVar5;
    auVar38._0_4_ = iVar5;
    auVar38._8_4_ = iVar5;
    auVar38._12_4_ = iVar5;
    auVar57 = pmulld(auVar110,auVar38);
    auVar35 = pmulld(auVar65,auVar38);
    auVar36 = pmulld(auVar83,auVar37);
    auVar81 = pmulld(auVar37,auVar62);
    auVar25 = pmulld(auVar62,auVar38);
    auVar39 = pmulld(auVar83,auVar38);
    auVar66._0_4_ = iVar108 + iVar49;
    auVar66._4_4_ = iVar113 + iVar54;
    auVar66._8_4_ = iVar114 + iVar55;
    auVar66._12_4_ = iVar115 + iVar56;
    auVar109._0_4_ = iVar108 - iVar49;
    auVar109._4_4_ = iVar113 - iVar54;
    auVar109._8_4_ = iVar114 - iVar55;
    auVar109._12_4_ = iVar115 - iVar56;
    auVar82._0_4_ = iVar101 + iVar70;
    auVar82._4_4_ = iVar105 + iVar72;
    auVar82._8_4_ = iVar106 + iVar73;
    auVar82._12_4_ = iVar107 + iVar74;
    auVar116._0_4_ = iVar101 - iVar70;
    auVar116._4_4_ = iVar105 - iVar72;
    auVar116._8_4_ = iVar106 - iVar73;
    auVar116._12_4_ = iVar107 - iVar74;
    auVar40 = pmulld(auVar97,auVar37);
    auVar61 = pmulld(auVar37,auVar117);
    auVar71 = pmulld(auVar117,auVar38);
    auVar50 = pmulld(auVar97,auVar38);
    auVar97 = ZEXT416((uint)bit);
    iVar43 = auVar25._0_4_ + iVar22 + auVar36._0_4_ >> auVar97;
    iVar46 = auVar25._4_4_ + iVar22 + auVar36._4_4_ >> auVar97;
    iVar47 = auVar25._8_4_ + iVar22 + auVar36._8_4_ >> auVar97;
    iVar48 = auVar25._12_4_ + iVar22 + auVar36._12_4_ >> auVar97;
    iVar96 = iVar43 + iVar89;
    iVar98 = iVar46 + iVar91;
    iVar99 = iVar47 + iVar93;
    iVar100 = iVar48 + iVar95;
    iVar89 = iVar89 - iVar43;
    iVar91 = iVar91 - iVar46;
    iVar93 = iVar93 - iVar47;
    iVar95 = iVar95 - iVar48;
    iVar60 = auVar57._0_4_ + iVar22 + auVar44._0_4_ >> auVar97;
    iVar68 = auVar57._4_4_ + iVar22 + auVar44._4_4_ >> auVar97;
    iVar70 = auVar57._8_4_ + iVar22 + auVar44._8_4_ >> auVar97;
    iVar73 = auVar57._12_4_ + iVar22 + auVar44._12_4_ >> auVar97;
    iVar49 = (iVar22 - auVar81._0_4_) + auVar39._0_4_ >> auVar97;
    iVar54 = (iVar22 - auVar81._4_4_) + auVar39._4_4_ >> auVar97;
    iVar55 = (iVar22 - auVar81._8_4_) + auVar39._8_4_ >> auVar97;
    iVar56 = (iVar22 - auVar81._12_4_) + auVar39._12_4_ >> auVar97;
    auVar63._0_4_ = iVar60 + iVar88;
    auVar63._4_4_ = iVar68 + iVar90;
    auVar63._8_4_ = iVar70 + iVar92;
    auVar63._12_4_ = iVar73 + iVar94;
    iVar67 = iVar26 - iVar49;
    iVar69 = iVar29 - iVar54;
    iVar72 = iVar31 - iVar55;
    iVar74 = iVar33 - iVar56;
    iVar49 = iVar49 + iVar26;
    iVar54 = iVar54 + iVar29;
    iVar55 = iVar55 + iVar31;
    iVar56 = iVar56 + iVar33;
    iVar43 = (iVar22 - auVar80._0_4_) + auVar35._0_4_ >> auVar97;
    iVar46 = (iVar22 - auVar80._4_4_) + auVar35._4_4_ >> auVar97;
    iVar47 = (iVar22 - auVar80._8_4_) + auVar35._8_4_ >> auVar97;
    iVar48 = (iVar22 - auVar80._12_4_) + auVar35._12_4_ >> auVar97;
    auVar58._0_4_ = iVar27 - iVar43;
    auVar58._4_4_ = iVar30 - iVar46;
    auVar58._8_4_ = iVar32 - iVar47;
    auVar58._12_4_ = iVar34 - iVar48;
    auVar102._0_4_ = iVar43 + iVar27;
    auVar102._4_4_ = iVar46 + iVar30;
    auVar102._8_4_ = iVar47 + iVar32;
    auVar102._12_4_ = iVar48 + iVar34;
    auVar37 = pmulld(auVar66,auVar38);
    auVar83 = pmulld(auVar82,auVar38);
    auVar52._4_4_ = iVar4;
    auVar52._0_4_ = iVar4;
    auVar52._8_4_ = iVar4;
    auVar52._12_4_ = iVar4;
    auVar38 = pmulld(auVar52,auVar116);
    auVar59._4_4_ = iVar6;
    auVar59._0_4_ = iVar6;
    auVar59._8_4_ = iVar6;
    auVar59._12_4_ = iVar6;
    auVar117 = pmulld(auVar116,auVar59);
    auVar62 = pmulld(auVar109,auVar52);
    iVar43 = auVar40._0_4_ + iVar22 + auVar71._0_4_ >> auVar97;
    iVar46 = auVar40._4_4_ + iVar22 + auVar71._4_4_ >> auVar97;
    iVar47 = auVar40._8_4_ + iVar22 + auVar71._8_4_ >> auVar97;
    iVar48 = auVar40._12_4_ + iVar22 + auVar71._12_4_ >> auVar97;
    auVar110 = pmulld(auVar109,auVar59);
    auVar104._0_4_ = iVar43 + iVar79;
    auVar104._4_4_ = iVar46 + iVar85;
    auVar104._8_4_ = iVar47 + iVar86;
    auVar104._12_4_ = iVar48 + iVar87;
    auVar84._0_4_ = iVar79 - iVar43;
    auVar84._4_4_ = iVar85 - iVar46;
    auVar84._8_4_ = iVar86 - iVar47;
    auVar84._12_4_ = iVar87 - iVar48;
    iVar43 = (auVar50._0_4_ + iVar22) - auVar61._0_4_ >> auVar97;
    iVar46 = (auVar50._4_4_ + iVar22) - auVar61._4_4_ >> auVar97;
    iVar47 = (auVar50._8_4_ + iVar22) - auVar61._8_4_ >> auVar97;
    iVar48 = (auVar50._12_4_ + iVar22) - auVar61._12_4_ >> auVar97;
    auVar118._0_4_ = iVar75 - iVar43;
    auVar118._4_4_ = iVar76 - iVar46;
    auVar118._8_4_ = iVar77 - iVar47;
    auVar118._12_4_ = iVar78 - iVar48;
    auVar119._0_4_ = iVar43 + iVar75;
    auVar119._4_4_ = iVar46 + iVar76;
    auVar119._8_4_ = iVar47 + iVar77;
    auVar119._12_4_ = iVar48 + iVar78;
    auVar41._4_4_ = iVar21;
    auVar41._0_4_ = iVar21;
    auVar41._8_4_ = iVar21;
    auVar41._12_4_ = iVar21;
    auVar57 = pmulld(auVar63,auVar41);
    auVar36 = pmulld(auVar41,auVar102);
    auVar50 = pmulld(auVar102,auVar59);
    auVar35 = pmulld(auVar63,auVar59);
    auVar25._4_4_ = iVar90 - iVar68;
    auVar25._0_4_ = iVar88 - iVar60;
    auVar25._8_4_ = iVar92 - iVar70;
    auVar25._12_4_ = iVar94 - iVar73;
    auVar45._4_4_ = iVar24;
    auVar45._0_4_ = iVar24;
    auVar45._8_4_ = iVar24;
    auVar45._12_4_ = iVar24;
    auVar39 = pmulld(auVar25,auVar45);
    auVar40 = pmulld(auVar45,auVar58);
    auVar44 = pmulld(auVar58,auVar41);
    auVar25 = pmulld(auVar25,auVar41);
    auVar81._4_4_ = uVar8;
    auVar81._0_4_ = uVar8;
    auVar81._8_4_ = uVar8;
    auVar81._12_4_ = uVar8;
    auVar41 = pmulld(auVar81,auVar104);
    auVar51._4_4_ = uVar7;
    auVar51._0_4_ = uVar7;
    auVar51._8_4_ = uVar7;
    auVar51._12_4_ = uVar7;
    auVar45 = pmulld(auVar104,auVar51);
    auVar59 = pmulld(auVar119,auVar81);
    auVar51 = pmulld(auVar119,auVar51);
    auVar71._4_4_ = uVar10;
    auVar71._0_4_ = uVar10;
    auVar71._8_4_ = uVar10;
    auVar71._12_4_ = uVar10;
    auVar52 = pmulld(auVar71,auVar84);
    auVar80._4_4_ = uVar9;
    auVar80._0_4_ = uVar9;
    auVar80._8_4_ = uVar9;
    auVar80._12_4_ = uVar9;
    auVar81 = pmulld(auVar84,auVar80);
    auVar71 = pmulld(auVar118,auVar71);
    iVar43 = auVar57._0_4_ + iVar22 + auVar50._0_4_ >> auVar97;
    iVar46 = auVar57._4_4_ + iVar22 + auVar50._4_4_ >> auVar97;
    iVar47 = auVar57._8_4_ + iVar22 + auVar50._8_4_ >> auVar97;
    iVar48 = auVar57._12_4_ + iVar22 + auVar50._12_4_ >> auVar97;
    auVar119 = pmulld(auVar118,auVar80);
    auVar103._0_4_ = iVar43 + iVar96;
    auVar103._4_4_ = iVar46 + iVar98;
    auVar103._8_4_ = iVar47 + iVar99;
    auVar103._12_4_ = iVar48 + iVar100;
    auVar112._0_4_ = iVar96 - iVar43;
    auVar112._4_4_ = iVar98 - iVar46;
    auVar112._8_4_ = iVar99 - iVar47;
    auVar112._12_4_ = iVar100 - iVar48;
    iVar43 = auVar39._0_4_ + iVar22 + auVar44._0_4_ >> auVar97;
    iVar46 = auVar39._4_4_ + iVar22 + auVar44._4_4_ >> auVar97;
    iVar47 = auVar39._8_4_ + iVar22 + auVar44._8_4_ >> auVar97;
    iVar48 = auVar39._12_4_ + iVar22 + auVar44._12_4_ >> auVar97;
    auVar111._0_4_ = iVar89 - iVar43;
    auVar111._4_4_ = iVar91 - iVar46;
    auVar111._8_4_ = iVar93 - iVar47;
    auVar111._12_4_ = iVar95 - iVar48;
    auVar28._0_4_ = iVar43 + iVar89;
    auVar28._4_4_ = iVar46 + iVar91;
    auVar28._8_4_ = iVar47 + iVar93;
    auVar28._12_4_ = iVar48 + iVar95;
    iVar43 = (auVar25._0_4_ + iVar22) - auVar40._0_4_ >> auVar97;
    iVar46 = (auVar25._4_4_ + iVar22) - auVar40._4_4_ >> auVar97;
    iVar47 = (auVar25._8_4_ + iVar22) - auVar40._8_4_ >> auVar97;
    iVar48 = (auVar25._12_4_ + iVar22) - auVar40._12_4_ >> auVar97;
    auVar120._0_4_ = iVar43 + iVar67;
    auVar120._4_4_ = iVar46 + iVar69;
    auVar120._8_4_ = iVar47 + iVar72;
    auVar120._12_4_ = iVar48 + iVar74;
    auVar42._0_4_ = iVar67 - iVar43;
    auVar42._4_4_ = iVar69 - iVar46;
    auVar42._8_4_ = iVar72 - iVar47;
    auVar42._12_4_ = iVar74 - iVar48;
    iVar43 = (auVar35._0_4_ + iVar22) - auVar36._0_4_ >> auVar97;
    iVar46 = (auVar35._4_4_ + iVar22) - auVar36._4_4_ >> auVar97;
    iVar47 = (auVar35._8_4_ + iVar22) - auVar36._8_4_ >> auVar97;
    iVar48 = (auVar35._12_4_ + iVar22) - auVar36._12_4_ >> auVar97;
    auVar53._0_4_ = iVar49 - iVar43;
    auVar53._4_4_ = iVar54 - iVar46;
    auVar53._8_4_ = iVar55 - iVar47;
    auVar53._12_4_ = iVar56 - iVar48;
    auVar64._0_4_ = iVar43 + iVar49;
    auVar64._4_4_ = iVar46 + iVar54;
    auVar64._8_4_ = iVar47 + iVar55;
    auVar64._12_4_ = iVar48 + iVar56;
    auVar57._4_4_ = uVar12;
    auVar57._0_4_ = uVar12;
    auVar57._8_4_ = uVar12;
    auVar57._12_4_ = uVar12;
    auVar63 = pmulld(auVar57,auVar103);
    auVar61._4_4_ = uVar11;
    auVar61._0_4_ = uVar11;
    auVar61._8_4_ = uVar11;
    auVar61._12_4_ = uVar11;
    auVar104 = pmulld(auVar103,auVar61);
    auVar80 = pmulld(auVar64,auVar57);
    auVar25 = pmulld(auVar64,auVar61);
    auVar44._4_4_ = uVar14;
    auVar44._0_4_ = uVar14;
    auVar44._8_4_ = uVar14;
    auVar44._12_4_ = uVar14;
    auVar64 = pmulld(auVar44,auVar112);
    auVar50._4_4_ = uVar13;
    auVar50._0_4_ = uVar13;
    auVar50._8_4_ = uVar13;
    auVar50._12_4_ = uVar13;
    auVar57 = pmulld(auVar112,auVar50);
    auVar44 = pmulld(auVar53,auVar44);
    auVar50 = pmulld(auVar53,auVar50);
    auVar39._4_4_ = uVar16;
    auVar39._0_4_ = uVar16;
    auVar39._8_4_ = uVar16;
    auVar39._12_4_ = uVar16;
    auVar65 = pmulld(auVar39,auVar111);
    auVar40._4_4_ = uVar15;
    auVar40._0_4_ = uVar15;
    auVar40._8_4_ = uVar15;
    auVar40._12_4_ = uVar15;
    auVar112 = pmulld(auVar111,auVar40);
    auVar61 = pmulld(auVar42,auVar39);
    auVar40 = pmulld(auVar42,auVar40);
    local_2b8 = CONCAT44((iVar22 - auVar83._4_4_) + auVar37._4_4_ >> auVar97,
                         (iVar22 - auVar83._0_4_) + auVar37._0_4_ >> auVar97);
    local_2c8 = CONCAT44(auVar117._4_4_ + iVar22 + auVar62._4_4_ >> auVar97,
                         auVar117._0_4_ + iVar22 + auVar62._0_4_ >> auVar97);
    local_298 = CONCAT44(auVar81._4_4_ + iVar22 + auVar71._4_4_ >> auVar97,
                         auVar81._0_4_ + iVar22 + auVar71._0_4_ >> auVar97);
    auVar35._4_4_ = uVar18;
    auVar35._0_4_ = uVar18;
    auVar35._8_4_ = uVar18;
    auVar35._12_4_ = uVar18;
    auVar66 = pmulld(auVar35,auVar28);
    auVar36._4_4_ = uVar17;
    auVar36._0_4_ = uVar17;
    auVar36._8_4_ = uVar17;
    auVar36._12_4_ = uVar17;
    auVar39 = pmulld(auVar28,auVar36);
    auVar35 = pmulld(auVar120,auVar35);
    auVar36 = pmulld(auVar120,auVar36);
    piVar1 = (int *)((long)*out + lVar20);
    *piVar1 = auVar83._0_4_ + iVar22 + auVar37._0_4_ >> auVar97;
    piVar1[1] = auVar83._4_4_ + iVar22 + auVar37._4_4_ >> auVar97;
    piVar1[2] = auVar83._8_4_ + iVar22 + auVar37._8_4_ >> auVar97;
    piVar1[3] = auVar83._12_4_ + iVar22 + auVar37._12_4_ >> auVar97;
    piVar1 = (int *)((long)out[col_num] + lVar20);
    *piVar1 = auVar104._0_4_ + iVar22 + auVar80._0_4_ >> auVar97;
    piVar1[1] = auVar104._4_4_ + iVar22 + auVar80._4_4_ >> auVar97;
    piVar1[2] = auVar104._8_4_ + iVar22 + auVar80._8_4_ >> auVar97;
    piVar1[3] = auVar104._12_4_ + iVar22 + auVar80._12_4_ >> auVar97;
    puVar3 = (undefined8 *)((long)out[col_num * 2] + lVar20);
    *puVar3 = CONCAT44(auVar45._4_4_ + iVar22 + auVar59._4_4_ >> auVar97,
                       auVar45._0_4_ + iVar22 + auVar59._0_4_ >> auVar97);
    puVar3[1] = CONCAT44(auVar45._12_4_ + iVar22 + auVar59._12_4_ >> auVar97,
                         auVar45._8_4_ + iVar22 + auVar59._8_4_ >> auVar97);
    piVar1 = (int *)((long)out[col_num * 3] + lVar20);
    *piVar1 = (iVar22 - auVar66._0_4_) + auVar36._0_4_ >> auVar97;
    piVar1[1] = (iVar22 - auVar66._4_4_) + auVar36._4_4_ >> auVar97;
    piVar1[2] = (iVar22 - auVar66._8_4_) + auVar36._8_4_ >> auVar97;
    piVar1[3] = (iVar22 - auVar66._12_4_) + auVar36._12_4_ >> auVar97;
    puVar3 = (undefined8 *)((long)out[col_num * 4] + lVar20);
    *puVar3 = local_2c8;
    puVar3[1] = CONCAT44(auVar117._12_4_ + iVar22 + auVar62._12_4_ >> auVar97,
                         auVar117._8_4_ + iVar22 + auVar62._8_4_ >> auVar97);
    piVar1 = (int *)((long)out[col_num * 5] + lVar20);
    *piVar1 = auVar112._0_4_ + iVar22 + auVar61._0_4_ >> auVar97;
    piVar1[1] = auVar112._4_4_ + iVar22 + auVar61._4_4_ >> auVar97;
    piVar1[2] = auVar112._8_4_ + iVar22 + auVar61._8_4_ >> auVar97;
    piVar1[3] = auVar112._12_4_ + iVar22 + auVar61._12_4_ >> auVar97;
    piVar1 = (int *)((long)out[col_num * 6] + lVar20);
    *piVar1 = (iVar22 - auVar52._0_4_) + auVar119._0_4_ >> auVar97;
    piVar1[1] = (iVar22 - auVar52._4_4_) + auVar119._4_4_ >> auVar97;
    piVar1[2] = (iVar22 - auVar52._8_4_) + auVar119._8_4_ >> auVar97;
    piVar1[3] = (iVar22 - auVar52._12_4_) + auVar119._12_4_ >> auVar97;
    piVar1 = (int *)((long)out[col_num * 7] + lVar20);
    *piVar1 = (iVar22 - auVar64._0_4_) + auVar50._0_4_ >> auVar97;
    piVar1[1] = (iVar22 - auVar64._4_4_) + auVar50._4_4_ >> auVar97;
    piVar1[2] = (iVar22 - auVar64._8_4_) + auVar50._8_4_ >> auVar97;
    piVar1[3] = (iVar22 - auVar64._12_4_) + auVar50._12_4_ >> auVar97;
    puVar3 = (undefined8 *)((long)out[col_num * 8] + lVar20);
    *puVar3 = local_2b8;
    puVar3[1] = CONCAT44((iVar22 - auVar83._12_4_) + auVar37._12_4_ >> auVar97,
                         (iVar22 - auVar83._8_4_) + auVar37._8_4_ >> auVar97);
    piVar1 = (int *)((long)out[col_num * 9] + lVar20);
    *piVar1 = auVar57._0_4_ + iVar22 + auVar44._0_4_ >> auVar97;
    piVar1[1] = auVar57._4_4_ + iVar22 + auVar44._4_4_ >> auVar97;
    piVar1[2] = auVar57._8_4_ + iVar22 + auVar44._8_4_ >> auVar97;
    piVar1[3] = auVar57._12_4_ + iVar22 + auVar44._12_4_ >> auVar97;
    puVar3 = (undefined8 *)((long)out[col_num * 10] + lVar20);
    *puVar3 = local_298;
    puVar3[1] = CONCAT44(auVar81._12_4_ + iVar22 + auVar71._12_4_ >> auVar97,
                         auVar81._8_4_ + iVar22 + auVar71._8_4_ >> auVar97);
    piVar1 = (int *)((long)out[col_num * 0xb] + lVar20);
    *piVar1 = (iVar22 - auVar65._0_4_) + auVar40._0_4_ >> auVar97;
    piVar1[1] = (iVar22 - auVar65._4_4_) + auVar40._4_4_ >> auVar97;
    piVar1[2] = (iVar22 - auVar65._8_4_) + auVar40._8_4_ >> auVar97;
    piVar1[3] = (iVar22 - auVar65._12_4_) + auVar40._12_4_ >> auVar97;
    puVar3 = (undefined8 *)((long)out[col_num * 0xc] + lVar20);
    *puVar3 = CONCAT44((iVar22 - auVar38._4_4_) + auVar110._4_4_ >> auVar97,
                       (iVar22 - auVar38._0_4_) + auVar110._0_4_ >> auVar97);
    puVar3[1] = CONCAT44((iVar22 - auVar38._12_4_) + auVar110._12_4_ >> auVar97,
                         (iVar22 - auVar38._8_4_) + auVar110._8_4_ >> auVar97);
    piVar1 = (int *)((long)out[col_num * 0xd] + lVar20);
    *piVar1 = auVar39._0_4_ + iVar22 + auVar35._0_4_ >> auVar97;
    piVar1[1] = auVar39._4_4_ + iVar22 + auVar35._4_4_ >> auVar97;
    piVar1[2] = auVar39._8_4_ + iVar22 + auVar35._8_4_ >> auVar97;
    piVar1[3] = auVar39._12_4_ + iVar22 + auVar35._12_4_ >> auVar97;
    puVar3 = (undefined8 *)((long)out[col_num * 0xe] + lVar20);
    *puVar3 = CONCAT44((iVar22 - auVar41._4_4_) + auVar51._4_4_ >> auVar97,
                       (iVar22 - auVar41._0_4_) + auVar51._0_4_ >> auVar97);
    puVar3[1] = CONCAT44((iVar22 - auVar41._12_4_) + auVar51._12_4_ >> auVar97,
                         (iVar22 - auVar41._8_4_) + auVar51._8_4_ >> auVar97);
    piVar1 = (int *)((long)out[col_num * 0xf] + lVar20);
    *piVar1 = (iVar22 - auVar63._0_4_) + auVar25._0_4_ >> auVar97;
    piVar1[1] = (iVar22 - auVar63._4_4_) + auVar25._4_4_ >> auVar97;
    piVar1[2] = (iVar22 - auVar63._8_4_) + auVar25._8_4_ >> auVar97;
    piVar1[3] = (iVar22 - auVar63._12_4_) + auVar25._12_4_ >> auVar97;
  }
  return;
}

Assistant:

static void fdct16x16_sse4_1(__m128i *in, __m128i *out, int bit,
                             const int col_num) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  __m128i u[16], v[16], x;
  int col;

  // Calculate the column 0, 1, 2, 3
  for (col = 0; col < col_num; ++col) {
    // stage 0
    // stage 1
    u[0] = _mm_add_epi32(in[0 * col_num + col], in[15 * col_num + col]);
    u[15] = _mm_sub_epi32(in[0 * col_num + col], in[15 * col_num + col]);
    u[1] = _mm_add_epi32(in[1 * col_num + col], in[14 * col_num + col]);
    u[14] = _mm_sub_epi32(in[1 * col_num + col], in[14 * col_num + col]);
    u[2] = _mm_add_epi32(in[2 * col_num + col], in[13 * col_num + col]);
    u[13] = _mm_sub_epi32(in[2 * col_num + col], in[13 * col_num + col]);
    u[3] = _mm_add_epi32(in[3 * col_num + col], in[12 * col_num + col]);
    u[12] = _mm_sub_epi32(in[3 * col_num + col], in[12 * col_num + col]);
    u[4] = _mm_add_epi32(in[4 * col_num + col], in[11 * col_num + col]);
    u[11] = _mm_sub_epi32(in[4 * col_num + col], in[11 * col_num + col]);
    u[5] = _mm_add_epi32(in[5 * col_num + col], in[10 * col_num + col]);
    u[10] = _mm_sub_epi32(in[5 * col_num + col], in[10 * col_num + col]);
    u[6] = _mm_add_epi32(in[6 * col_num + col], in[9 * col_num + col]);
    u[9] = _mm_sub_epi32(in[6 * col_num + col], in[9 * col_num + col]);
    u[7] = _mm_add_epi32(in[7 * col_num + col], in[8 * col_num + col]);
    u[8] = _mm_sub_epi32(in[7 * col_num + col], in[8 * col_num + col]);

    // stage 2
    v[0] = _mm_add_epi32(u[0], u[7]);
    v[7] = _mm_sub_epi32(u[0], u[7]);
    v[1] = _mm_add_epi32(u[1], u[6]);
    v[6] = _mm_sub_epi32(u[1], u[6]);
    v[2] = _mm_add_epi32(u[2], u[5]);
    v[5] = _mm_sub_epi32(u[2], u[5]);
    v[3] = _mm_add_epi32(u[3], u[4]);
    v[4] = _mm_sub_epi32(u[3], u[4]);
    v[8] = u[8];
    v[9] = u[9];

    v[10] = _mm_mullo_epi32(u[10], cospim32);
    x = _mm_mullo_epi32(u[13], cospi32);
    v[10] = _mm_add_epi32(v[10], x);
    v[10] = _mm_add_epi32(v[10], rnding);
    v[10] = _mm_srai_epi32(v[10], bit);

    v[13] = _mm_mullo_epi32(u[10], cospi32);
    x = _mm_mullo_epi32(u[13], cospim32);
    v[13] = _mm_sub_epi32(v[13], x);
    v[13] = _mm_add_epi32(v[13], rnding);
    v[13] = _mm_srai_epi32(v[13], bit);

    v[11] = _mm_mullo_epi32(u[11], cospim32);
    x = _mm_mullo_epi32(u[12], cospi32);
    v[11] = _mm_add_epi32(v[11], x);
    v[11] = _mm_add_epi32(v[11], rnding);
    v[11] = _mm_srai_epi32(v[11], bit);

    v[12] = _mm_mullo_epi32(u[11], cospi32);
    x = _mm_mullo_epi32(u[12], cospim32);
    v[12] = _mm_sub_epi32(v[12], x);
    v[12] = _mm_add_epi32(v[12], rnding);
    v[12] = _mm_srai_epi32(v[12], bit);
    v[14] = u[14];
    v[15] = u[15];

    // stage 3
    u[0] = _mm_add_epi32(v[0], v[3]);
    u[3] = _mm_sub_epi32(v[0], v[3]);
    u[1] = _mm_add_epi32(v[1], v[2]);
    u[2] = _mm_sub_epi32(v[1], v[2]);
    u[4] = v[4];

    u[5] = _mm_mullo_epi32(v[5], cospim32);
    x = _mm_mullo_epi32(v[6], cospi32);
    u[5] = _mm_add_epi32(u[5], x);
    u[5] = _mm_add_epi32(u[5], rnding);
    u[5] = _mm_srai_epi32(u[5], bit);

    u[6] = _mm_mullo_epi32(v[5], cospi32);
    x = _mm_mullo_epi32(v[6], cospim32);
    u[6] = _mm_sub_epi32(u[6], x);
    u[6] = _mm_add_epi32(u[6], rnding);
    u[6] = _mm_srai_epi32(u[6], bit);

    u[7] = v[7];
    u[8] = _mm_add_epi32(v[8], v[11]);
    u[11] = _mm_sub_epi32(v[8], v[11]);
    u[9] = _mm_add_epi32(v[9], v[10]);
    u[10] = _mm_sub_epi32(v[9], v[10]);
    u[12] = _mm_sub_epi32(v[15], v[12]);
    u[15] = _mm_add_epi32(v[15], v[12]);
    u[13] = _mm_sub_epi32(v[14], v[13]);
    u[14] = _mm_add_epi32(v[14], v[13]);

    // stage 4
    u[0] = _mm_mullo_epi32(u[0], cospi32);
    u[1] = _mm_mullo_epi32(u[1], cospi32);
    v[0] = _mm_add_epi32(u[0], u[1]);
    v[0] = _mm_add_epi32(v[0], rnding);
    v[0] = _mm_srai_epi32(v[0], bit);

    v[1] = _mm_sub_epi32(u[0], u[1]);
    v[1] = _mm_add_epi32(v[1], rnding);
    v[1] = _mm_srai_epi32(v[1], bit);

    v[2] = _mm_mullo_epi32(u[2], cospi48);
    x = _mm_mullo_epi32(u[3], cospi16);
    v[2] = _mm_add_epi32(v[2], x);
    v[2] = _mm_add_epi32(v[2], rnding);
    v[2] = _mm_srai_epi32(v[2], bit);

    v[3] = _mm_mullo_epi32(u[2], cospi16);
    x = _mm_mullo_epi32(u[3], cospi48);
    v[3] = _mm_sub_epi32(x, v[3]);
    v[3] = _mm_add_epi32(v[3], rnding);
    v[3] = _mm_srai_epi32(v[3], bit);

    v[4] = _mm_add_epi32(u[4], u[5]);
    v[5] = _mm_sub_epi32(u[4], u[5]);
    v[6] = _mm_sub_epi32(u[7], u[6]);
    v[7] = _mm_add_epi32(u[7], u[6]);
    v[8] = u[8];

    v[9] = _mm_mullo_epi32(u[9], cospim16);
    x = _mm_mullo_epi32(u[14], cospi48);
    v[9] = _mm_add_epi32(v[9], x);
    v[9] = _mm_add_epi32(v[9], rnding);
    v[9] = _mm_srai_epi32(v[9], bit);

    v[14] = _mm_mullo_epi32(u[9], cospi48);
    x = _mm_mullo_epi32(u[14], cospim16);
    v[14] = _mm_sub_epi32(v[14], x);
    v[14] = _mm_add_epi32(v[14], rnding);
    v[14] = _mm_srai_epi32(v[14], bit);

    v[10] = _mm_mullo_epi32(u[10], cospim48);
    x = _mm_mullo_epi32(u[13], cospim16);
    v[10] = _mm_add_epi32(v[10], x);
    v[10] = _mm_add_epi32(v[10], rnding);
    v[10] = _mm_srai_epi32(v[10], bit);

    v[13] = _mm_mullo_epi32(u[10], cospim16);
    x = _mm_mullo_epi32(u[13], cospim48);
    v[13] = _mm_sub_epi32(v[13], x);
    v[13] = _mm_add_epi32(v[13], rnding);
    v[13] = _mm_srai_epi32(v[13], bit);

    v[11] = u[11];
    v[12] = u[12];
    v[15] = u[15];

    // stage 5
    u[0] = v[0];
    u[1] = v[1];
    u[2] = v[2];
    u[3] = v[3];

    u[4] = _mm_mullo_epi32(v[4], cospi56);
    x = _mm_mullo_epi32(v[7], cospi8);
    u[4] = _mm_add_epi32(u[4], x);
    u[4] = _mm_add_epi32(u[4], rnding);
    u[4] = _mm_srai_epi32(u[4], bit);

    u[7] = _mm_mullo_epi32(v[4], cospi8);
    x = _mm_mullo_epi32(v[7], cospi56);
    u[7] = _mm_sub_epi32(x, u[7]);
    u[7] = _mm_add_epi32(u[7], rnding);
    u[7] = _mm_srai_epi32(u[7], bit);

    u[5] = _mm_mullo_epi32(v[5], cospi24);
    x = _mm_mullo_epi32(v[6], cospi40);
    u[5] = _mm_add_epi32(u[5], x);
    u[5] = _mm_add_epi32(u[5], rnding);
    u[5] = _mm_srai_epi32(u[5], bit);

    u[6] = _mm_mullo_epi32(v[5], cospi40);
    x = _mm_mullo_epi32(v[6], cospi24);
    u[6] = _mm_sub_epi32(x, u[6]);
    u[6] = _mm_add_epi32(u[6], rnding);
    u[6] = _mm_srai_epi32(u[6], bit);

    u[8] = _mm_add_epi32(v[8], v[9]);
    u[9] = _mm_sub_epi32(v[8], v[9]);
    u[10] = _mm_sub_epi32(v[11], v[10]);
    u[11] = _mm_add_epi32(v[11], v[10]);
    u[12] = _mm_add_epi32(v[12], v[13]);
    u[13] = _mm_sub_epi32(v[12], v[13]);
    u[14] = _mm_sub_epi32(v[15], v[14]);
    u[15] = _mm_add_epi32(v[15], v[14]);

    // stage 6
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = u[4];
    v[5] = u[5];
    v[6] = u[6];
    v[7] = u[7];

    v[8] = _mm_mullo_epi32(u[8], cospi60);
    x = _mm_mullo_epi32(u[15], cospi4);
    v[8] = _mm_add_epi32(v[8], x);
    v[8] = _mm_add_epi32(v[8], rnding);
    v[8] = _mm_srai_epi32(v[8], bit);

    v[15] = _mm_mullo_epi32(u[8], cospi4);
    x = _mm_mullo_epi32(u[15], cospi60);
    v[15] = _mm_sub_epi32(x, v[15]);
    v[15] = _mm_add_epi32(v[15], rnding);
    v[15] = _mm_srai_epi32(v[15], bit);

    v[9] = _mm_mullo_epi32(u[9], cospi28);
    x = _mm_mullo_epi32(u[14], cospi36);
    v[9] = _mm_add_epi32(v[9], x);
    v[9] = _mm_add_epi32(v[9], rnding);
    v[9] = _mm_srai_epi32(v[9], bit);

    v[14] = _mm_mullo_epi32(u[9], cospi36);
    x = _mm_mullo_epi32(u[14], cospi28);
    v[14] = _mm_sub_epi32(x, v[14]);
    v[14] = _mm_add_epi32(v[14], rnding);
    v[14] = _mm_srai_epi32(v[14], bit);

    v[10] = _mm_mullo_epi32(u[10], cospi44);
    x = _mm_mullo_epi32(u[13], cospi20);
    v[10] = _mm_add_epi32(v[10], x);
    v[10] = _mm_add_epi32(v[10], rnding);
    v[10] = _mm_srai_epi32(v[10], bit);

    v[13] = _mm_mullo_epi32(u[10], cospi20);
    x = _mm_mullo_epi32(u[13], cospi44);
    v[13] = _mm_sub_epi32(x, v[13]);
    v[13] = _mm_add_epi32(v[13], rnding);
    v[13] = _mm_srai_epi32(v[13], bit);

    v[11] = _mm_mullo_epi32(u[11], cospi12);
    x = _mm_mullo_epi32(u[12], cospi52);
    v[11] = _mm_add_epi32(v[11], x);
    v[11] = _mm_add_epi32(v[11], rnding);
    v[11] = _mm_srai_epi32(v[11], bit);

    v[12] = _mm_mullo_epi32(u[11], cospi52);
    x = _mm_mullo_epi32(u[12], cospi12);
    v[12] = _mm_sub_epi32(x, v[12]);
    v[12] = _mm_add_epi32(v[12], rnding);
    v[12] = _mm_srai_epi32(v[12], bit);

    out[0 * col_num + col] = v[0];
    out[1 * col_num + col] = v[8];
    out[2 * col_num + col] = v[4];
    out[3 * col_num + col] = v[12];
    out[4 * col_num + col] = v[2];
    out[5 * col_num + col] = v[10];
    out[6 * col_num + col] = v[6];
    out[7 * col_num + col] = v[14];
    out[8 * col_num + col] = v[1];
    out[9 * col_num + col] = v[9];
    out[10 * col_num + col] = v[5];
    out[11 * col_num + col] = v[13];
    out[12 * col_num + col] = v[3];
    out[13 * col_num + col] = v[11];
    out[14 * col_num + col] = v[7];
    out[15 * col_num + col] = v[15];
  }
}